

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void pugi::impl::anon_unknown_0::text_output_indent
               (xml_buffered_writer *writer,char_t *indent,size_t indent_length,uint depth)

{
  uint *__n;
  void *extraout_RDX;
  uint local_38;
  uint local_34;
  uint i_4;
  uint i_3;
  uint i_2;
  uint i_1;
  uint i;
  uint depth_local;
  size_t indent_length_local;
  char_t *indent_local;
  xml_buffered_writer *writer_local;
  
  __n = &switchD_0011a62e::switchdataD_0012c448;
  switch(indent_length) {
  case 1:
    for (i_2 = 0; i_2 < depth; i_2 = i_2 + 1) {
      xml_buffered_writer::write(writer,(uint)*indent,(void *)indent_length,(size_t)__n);
      indent_length = (size_t)extraout_RDX;
    }
    break;
  case 2:
    for (i_3 = 0; i_3 < depth; i_3 = i_3 + 1) {
      __n = (uint *)CONCAT71((int7)((ulong)__n >> 8),*indent);
      xml_buffered_writer::write(writer,(uint)*indent,(void *)(ulong)indent[1],(size_t)__n);
    }
    break;
  case 3:
    for (i_4 = 0; i_4 < depth; i_4 = i_4 + 1) {
      xml_buffered_writer::write(writer,(uint)*indent,(void *)(ulong)indent[1],(ulong)indent[2]);
    }
    break;
  case 4:
    for (local_34 = 0; local_34 < depth; local_34 = local_34 + 1) {
      xml_buffered_writer::write(writer,(uint)*indent,(void *)(ulong)indent[1],(ulong)indent[2]);
    }
    break;
  default:
    for (local_38 = 0; local_38 < depth; local_38 = local_38 + 1) {
      xml_buffered_writer::write_buffer(writer,indent,indent_length);
    }
  }
  return;
}

Assistant:

PUGI__FN void text_output_indent(xml_buffered_writer& writer, const char_t* indent, size_t indent_length, unsigned int depth)
	{
		switch (indent_length)
		{
		case 1:
		{
			for (unsigned int i = 0; i < depth; ++i)
				writer.write(indent[0]);
			break;
		}

		case 2:
		{
			for (unsigned int i = 0; i < depth; ++i)
				writer.write(indent[0], indent[1]);
			break;
		}

		case 3:
		{
			for (unsigned int i = 0; i < depth; ++i)
				writer.write(indent[0], indent[1], indent[2]);
			break;
		}

		case 4:
		{
			for (unsigned int i = 0; i < depth; ++i)
				writer.write(indent[0], indent[1], indent[2], indent[3]);
			break;
		}

		default:
		{
			for (unsigned int i = 0; i < depth; ++i)
				writer.write_buffer(indent, indent_length);
		}
		}
	}